

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

void __thiscall PFloat::SetSymbols(PFloat *this,SymbolInitI *sym,size_t count)

{
  ENamedName EVar1;
  int iVar2;
  DObject *this_00;
  size_t sVar3;
  
  if (count != 0) {
    sVar3 = 0;
    do {
      this_00 = (DObject *)
                M_Malloc_Dbg(0x38,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                             ,0x1f9);
      EVar1 = sym[sVar3].Name;
      iVar2 = sym[sVar3].Value;
      DObject::DObject(this_00);
      *(ENamedName *)&this_00->field_0x24 = EVar1;
      this_00[1]._vptr_DObject = (_func_int **)this;
      this_00->_vptr_DObject = (_func_int **)&PTR_StaticType_006f87a0;
      *(int *)&this_00[1].Class = iVar2;
      PSymbolTable::AddSymbol(&(this->super_PBasicType).super_PType.Symbols,(PSymbol *)this_00);
      sVar3 = sVar3 + 1;
    } while (count != sVar3);
  }
  return;
}

Assistant:

void PFloat::SetSymbols(const PFloat::SymbolInitI *sym, size_t count)
{
	for (size_t i = 0; i < count; ++i)
	{
		Symbols.AddSymbol(new PSymbolConstNumeric(sym[i].Name, this, sym[i].Value));
	}
}